

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O3

void sha1_Final(SHA1_CTX *context,sha2_byte *digest)

{
  uint32_t *data;
  uint32_t *puVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined8 uVar25;
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  int j;
  uint uVar29;
  long lVar30;
  uint uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  
  if (digest != (sha2_byte *)0x0) {
    uVar31 = (uint)context->bitcount >> 3 & 0x3f;
    data = context->buffer;
    uVar29 = uVar31 + 1;
    *(undefined1 *)((long)context->buffer + (ulong)uVar31) = 0x80;
    if (0x37 < uVar31) {
      memzero((void *)((ulong)uVar29 + (long)data),(ulong)(uVar31 ^ 0x3f));
      lVar30 = 8;
      do {
        auVar32 = *(undefined1 (*) [16])(context->state + lVar30);
        auVar33[1] = 0;
        auVar33[0] = auVar32[8];
        auVar33[2] = auVar32[9];
        auVar33[3] = 0;
        auVar33[4] = auVar32[10];
        auVar33[5] = 0;
        auVar33[6] = auVar32[0xb];
        auVar33[7] = 0;
        auVar33[8] = auVar32[0xc];
        auVar33[9] = 0;
        auVar33[10] = auVar32[0xd];
        auVar33[0xb] = 0;
        auVar33[0xc] = auVar32[0xe];
        auVar33[0xd] = 0;
        auVar33[0xe] = auVar32[0xf];
        auVar33[0xf] = 0;
        auVar33 = pshuflw(auVar33,auVar33,0x1b);
        auVar33 = pshufhw(auVar33,auVar33,0x1b);
        auVar18[0xd] = 0;
        auVar18._0_13_ = auVar32._0_13_;
        auVar18[0xe] = auVar32[7];
        auVar19[0xc] = auVar32[6];
        auVar19._0_12_ = auVar32._0_12_;
        auVar19._13_2_ = auVar18._13_2_;
        auVar20[0xb] = 0;
        auVar20._0_11_ = auVar32._0_11_;
        auVar20._12_3_ = auVar19._12_3_;
        auVar21[10] = auVar32[5];
        auVar21._0_10_ = auVar32._0_10_;
        auVar21._11_4_ = auVar20._11_4_;
        auVar22[9] = 0;
        auVar22._0_9_ = auVar32._0_9_;
        auVar22._10_5_ = auVar21._10_5_;
        auVar23[8] = auVar32[4];
        auVar23._0_8_ = auVar32._0_8_;
        auVar23._9_6_ = auVar22._9_6_;
        auVar26._7_8_ = 0;
        auVar26._0_7_ = auVar23._8_7_;
        auVar27._1_8_ = SUB158(auVar26 << 0x40,7);
        auVar27[0] = auVar32[3];
        auVar27._9_6_ = 0;
        auVar28._1_10_ = SUB1510(auVar27 << 0x30,5);
        auVar28[0] = auVar32[2];
        auVar28._11_4_ = 0;
        auVar24[2] = auVar32[1];
        auVar24._0_2_ = auVar32._0_2_;
        auVar24._3_12_ = SUB1512(auVar28 << 0x20,3);
        auVar32._0_2_ = auVar32._0_2_ & 0xff;
        auVar32._2_13_ = auVar24._2_13_;
        auVar32[0xf] = 0;
        auVar32 = pshuflw(auVar32,auVar32,0x1b);
        auVar32 = pshufhw(auVar32,auVar32,0x1b);
        sVar2 = auVar32._0_2_;
        sVar3 = auVar32._2_2_;
        sVar4 = auVar32._4_2_;
        sVar5 = auVar32._6_2_;
        sVar6 = auVar32._8_2_;
        sVar7 = auVar32._10_2_;
        sVar8 = auVar32._12_2_;
        sVar9 = auVar32._14_2_;
        sVar10 = auVar33._0_2_;
        sVar11 = auVar33._2_2_;
        sVar12 = auVar33._4_2_;
        sVar13 = auVar33._6_2_;
        sVar14 = auVar33._8_2_;
        sVar15 = auVar33._10_2_;
        sVar16 = auVar33._12_2_;
        sVar17 = auVar33._14_2_;
        puVar1 = context->state + lVar30;
        *(char *)puVar1 = (0 < sVar2) * (sVar2 < 0x100) * auVar32[0] - (0xff < sVar2);
        *(char *)((long)puVar1 + 1) = (0 < sVar3) * (sVar3 < 0x100) * auVar32[2] - (0xff < sVar3);
        *(char *)((long)puVar1 + 2) = (0 < sVar4) * (sVar4 < 0x100) * auVar32[4] - (0xff < sVar4);
        *(char *)((long)puVar1 + 3) = (0 < sVar5) * (sVar5 < 0x100) * auVar32[6] - (0xff < sVar5);
        *(char *)(puVar1 + 1) = (0 < sVar6) * (sVar6 < 0x100) * auVar32[8] - (0xff < sVar6);
        *(char *)((long)puVar1 + 5) = (0 < sVar7) * (sVar7 < 0x100) * auVar32[10] - (0xff < sVar7);
        *(char *)((long)puVar1 + 6) = (0 < sVar8) * (sVar8 < 0x100) * auVar32[0xc] - (0xff < sVar8);
        *(char *)((long)puVar1 + 7) = (0 < sVar9) * (sVar9 < 0x100) * auVar32[0xe] - (0xff < sVar9);
        *(char *)(puVar1 + 2) = (0 < sVar10) * (sVar10 < 0x100) * auVar33[0] - (0xff < sVar10);
        *(char *)((long)puVar1 + 9) = (0 < sVar11) * (sVar11 < 0x100) * auVar33[2] - (0xff < sVar11)
        ;
        *(char *)((long)puVar1 + 10) =
             (0 < sVar12) * (sVar12 < 0x100) * auVar33[4] - (0xff < sVar12);
        *(char *)((long)puVar1 + 0xb) =
             (0 < sVar13) * (sVar13 < 0x100) * auVar33[6] - (0xff < sVar13);
        *(char *)(puVar1 + 3) = (0 < sVar14) * (sVar14 < 0x100) * auVar33[8] - (0xff < sVar14);
        *(char *)((long)puVar1 + 0xd) =
             (0 < sVar15) * (sVar15 < 0x100) * auVar33[10] - (0xff < sVar15);
        *(char *)((long)puVar1 + 0xe) =
             (0 < sVar16) * (sVar16 < 0x100) * auVar33[0xc] - (0xff < sVar16);
        *(char *)((long)puVar1 + 0xf) =
             (0 < sVar17) * (sVar17 < 0x100) * auVar33[0xe] - (0xff < sVar17);
        lVar30 = lVar30 + 4;
      } while (lVar30 != 0x18);
      sha1_Transform(context->state,data,context->state);
      uVar29 = 0;
    }
    memzero((void *)((ulong)uVar29 + (long)data),(ulong)(0x38 - uVar29));
    lVar30 = 8;
    do {
      uVar29 = context->state[lVar30];
      context->state[lVar30] =
           uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8 | uVar29 << 0x18;
      lVar30 = lVar30 + 1;
    } while (lVar30 != 0x16);
    *(uint64_t *)(context->buffer + 0xe) = context->bitcount >> 0x20 | context->bitcount << 0x20;
    sha1_Transform(context->state,data,context->state);
    lVar30 = 0;
    do {
      uVar29 = context->state[lVar30];
      context->state[lVar30] =
           uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8 | uVar29 << 0x18;
      lVar30 = lVar30 + 1;
    } while (lVar30 != 5);
    *(uint32_t *)(digest + 0x10) = context->state[4];
    uVar25 = *(undefined8 *)(context->state + 2);
    *(undefined8 *)digest = *(undefined8 *)context->state;
    *(undefined8 *)(digest + 8) = uVar25;
  }
  memzero(context,0x60);
  return;
}

Assistant:

void sha1_Final(trezor::SHA1_CTX* context, sha2_byte digest[]) {
	unsigned int	usedspace;

	/* If no digest buffer is passed, we don't bother doing this: */
	if (digest != (sha2_byte*)0) {
		usedspace = (context->bitcount >> 3) % SHA1_BLOCK_LENGTH;
		/* Begin padding with a 1 bit: */
		((uint8_t*)context->buffer)[usedspace++] = 0x80;

		if (usedspace > SHA1_SHORT_BLOCK_LENGTH) {
			memzero(((uint8_t*)context->buffer) + usedspace, SHA1_BLOCK_LENGTH - usedspace);

#if BYTE_ORDER == LITTLE_ENDIAN
			/* Convert TO host byte order */
			for (int j = 0; j < 16; j++) {
				REVERSE32(context->buffer[j],context->buffer[j]);
			}
#endif
			/* Do second-to-last transform: */
			sha1_Transform(context->state, context->buffer, context->state);

			/* And prepare the last transform: */
			usedspace = 0;
		}
		/* Set-up for the last transform: */
		memzero(((uint8_t*)context->buffer) + usedspace, SHA1_SHORT_BLOCK_LENGTH - usedspace);

#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert TO host byte order */
		for (int j = 0; j < 14; j++) {
			REVERSE32(context->buffer[j],context->buffer[j]);
		}
#endif
		/* Set the bit count: */
		context->buffer[14] = context->bitcount >> 32;
		context->buffer[15] = context->bitcount & 0xffffffff;

		/* Final transform: */
		sha1_Transform(context->state, context->buffer, context->state);

#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert FROM host byte order */
		for (int j = 0; j < 5; j++) {
			REVERSE32(context->state[j],context->state[j]);
		}
#endif
		MEMCPY_BCOPY(digest, context->state, SHA1_DIGEST_LENGTH);
	}

	/* Clean up state data: */
	memzero(context, sizeof(trezor::SHA1_CTX));
}